

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

void drawCellBorder(QTextDocumentLayoutPrivate *p,QPainter *painter,QTextTable *table,
                   QTextTableData *td,QTextTableCell *cell,QRectF *borderRect,Edge edge,
                   int forceHeaderRow,bool adjustTopAnchor,bool adjustBottomAnchor,
                   bool ignoreEdgesAbove)

{
  byte bVar1;
  BrushStyle BVar2;
  uint uVar3;
  int iVar4;
  QTextTable *table_00;
  QTextTableCell *cell_00;
  qreal xpos;
  long in_RCX;
  QTextDocumentLayoutPrivate *in_RDX;
  QTextTableCell *in_R8;
  long in_FS_OFFSET;
  qreal qVar5;
  uint in_stack_00000008;
  int in_stack_00000010;
  byte in_stack_00000018;
  byte in_stack_00000020;
  byte in_stack_00000028;
  BorderStyle cssStyle;
  BorderStyle borderStyle;
  qreal wv;
  qreal wh;
  undefined5 in_stack_000000c0;
  qreal in_stack_000000f8;
  QPainter *in_stack_00000100;
  QPointF offset;
  QBrush brush;
  QPointF p2;
  QPointF p1;
  QTextTableCell cellOrHeader;
  QTextTableCellFormat fmt;
  EdgeData edgeData;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  uint in_stack_fffffffffffffc50;
  undefined4 uVar6;
  GlobalColor in_stack_fffffffffffffc54;
  QRectF *in_stack_fffffffffffffc58;
  QTextTable *in_stack_fffffffffffffc60;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffc68;
  QTextTableCell *in_stack_fffffffffffffc78;
  undefined8 in_stack_fffffffffffffc88;
  Edge edge_00;
  undefined4 in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffc94;
  QTextTableData *in_stack_fffffffffffffc98;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  QTextTableCell *in_stack_fffffffffffffca8;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffcc0;
  BorderStyle local_310;
  QPointF local_2b8;
  QPointF local_2a8;
  QPointF local_298;
  QPointF local_288;
  QPointF local_278;
  QPointF local_260;
  QPointF local_250;
  QPointF local_240;
  QPointF local_230;
  QPointF local_220;
  QPointF local_210;
  QPointF local_200;
  QPointF local_1f0;
  QPointF local_1e0;
  QPointF local_1d0;
  QPointF local_1c0;
  QPointF local_1b0;
  QPointF local_1a0;
  QPointF local_190;
  QPointF local_180;
  QPointF local_170;
  QPointF local_160;
  QPointF local_150;
  QPointF local_140;
  QPointF local_130;
  QPointF local_120;
  QPointF local_110;
  QPointF local_100;
  QPointF local_f0;
  undefined1 *local_b8;
  QPointF local_b0;
  QPointF local_a0;
  QTextTableCell local_90;
  undefined1 local_80 [64];
  undefined1 *local_40;
  undefined1 *local_38;
  double local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined8 local_18;
  long local_10;
  
  edge_00 = (Edge)((ulong)in_stack_fffffffffffffc88 >> 0x20);
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_stack_00000028 & 1;
  local_a0.xp = -NAN;
  local_a0.yp = -NAN;
  QPointF::QPointF(&local_a0);
  local_b0.xp = -NAN;
  local_b0.yp = -NAN;
  QPointF::QPointF(&local_b0);
  local_30 = -NAN;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  axisEdgeData((QTextTable *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
               in_stack_fffffffffffffc98,
               (QTextTableCell *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90),
               edge_00);
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    QTextTableCell::format(in_stack_fffffffffffffc78);
    QTextFormat::toTableCellFormat
              ((QTextFormat *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x7fe7a3);
    local_310 = BorderStyle_None;
    local_b8 = &DAT_aaaaaaaaaaaaaaaa;
    QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
    if ((local_18._4_4_ == 4) || ((*(byte *)(in_RCX + 0x149) & 1) == 0)) {
      switch((ulong)local_18 & 0xffffffff) {
      case 0:
        QTextTableCellFormat::topBorderBrush
                  ((QTextTableCellFormat *)
                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::~QBrush((QBrush *)0x7fe8ea);
        local_310 = QTextTableCellFormat::topBorderStyle((QTextTableCellFormat *)0x7fe8f7);
        break;
      case 1:
        QTextTableCellFormat::rightBorderBrush
                  ((QTextTableCellFormat *)
                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::~QBrush((QBrush *)0x7fe9d7);
        local_310 = QTextTableCellFormat::rightBorderStyle((QTextTableCellFormat *)0x7fe9e4);
        break;
      case 2:
        QTextTableCellFormat::bottomBorderBrush
                  ((QTextTableCellFormat *)
                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::~QBrush((QBrush *)0x7fe93a);
        local_310 = QTextTableCellFormat::bottomBorderStyle((QTextTableCellFormat *)0x7fe947);
        break;
      case 3:
        QTextTableCellFormat::leftBorderBrush
                  ((QTextTableCellFormat *)
                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                          (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QBrush::~QBrush((QBrush *)0x7fe98a);
        local_310 = QTextTableCellFormat::leftBorderStyle((QTextTableCellFormat *)0x7fe997);
      }
    }
    else {
      QTextTable::format(in_stack_fffffffffffffc60);
      local_310 = QTextFrameFormat::borderStyle((QTextFrameFormat *)0x7fe80f);
      QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fe823);
      QTextTable::format(in_stack_fffffffffffffc60);
      QTextFrameFormat::borderBrush
                ((QTextFrameFormat *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      QBrush::operator=((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                        (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      QBrush::~QBrush((QBrush *)0x7fe86f);
      QTextTableFormat::~QTextTableFormat((QTextTableFormat *)0x7fe87c);
    }
    if (local_310 != BorderStyle_None) {
      BVar2 = QBrush::style((QBrush *)0x7fea18);
      if (BVar2 == NoBrush) {
        QBrush::operator=((QBrush *)in_stack_fffffffffffffc58,in_stack_fffffffffffffc54);
      }
      local_80._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_80._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextTableCell::QTextTableCell((QTextTableCell *)local_80,in_R8);
      if (in_stack_00000010 != -1) {
        QTextTableCell::column((QTextTableCell *)in_stack_fffffffffffffc58);
        QTextTable::cellAt((QTextTable *)in_stack_fffffffffffffc68,
                           (int)((ulong)in_stack_fffffffffffffc60 >> 0x20),
                           (int)in_stack_fffffffffffffc60);
        QTextTableCell::operator=((QTextTableCell *)local_80,&local_90);
        QTextTableCell::~QTextTableCell(&local_90);
        in_stack_fffffffffffffcc0 = in_RDX;
      }
      table_00 = (QTextTable *)(ulong)in_stack_00000008;
      switch(table_00) {
      case (QTextTable *)0x0:
        QTextDocumentLayoutPrivate::scaleToDevice
                  (in_stack_fffffffffffffc68,(qreal)in_stack_fffffffffffffc60);
        local_100 = QRectF::topLeft(in_stack_fffffffffffffc58);
        uVar3 = (uint)bVar1;
        prioritizedEdgeAnchorOffset
                  (in_stack_fffffffffffffcc0,table_00,
                   (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   in_stack_fffffffffffffca8,
                   (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
        iVar4 = qFloor<double>(4.14193659557307e-317);
        QPointF::QPointF(&local_110,(double)iVar4,0.0);
        local_f0 = operator+((QPointF *)in_stack_fffffffffffffc58,
                             (QPointF *)CONCAT44(in_stack_fffffffffffffc54,uVar3));
        local_a0.xp = local_f0.xp;
        local_a0.yp = local_f0.yp;
        local_130 = QRectF::topRight(in_stack_fffffffffffffc58);
        in_stack_fffffffffffffc48 = 1;
        in_stack_fffffffffffffc50 = (uint)bVar1;
        prioritizedEdgeAnchorOffset
                  (in_stack_fffffffffffffcc0,table_00,
                   (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   in_stack_fffffffffffffca8,
                   (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
        iVar4 = qCeil<double>(4.14203590276788e-317);
        QPointF::QPointF(&local_140,(double)-iVar4,0.0);
        local_120 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_b0.xp = local_120.xp;
        local_b0.yp = local_120.yp;
        break;
      case (QTextTable *)0x1:
        qVar5 = QTextDocumentLayoutPrivate::scaleToDevice
                          (in_stack_fffffffffffffc68,(qreal)in_stack_fffffffffffffc60);
        local_220 = QRectF::topRight(in_stack_fffffffffffffc58);
        cell_00 = (QTextTableCell *)((ulong)qVar5 ^ 0x8000000000000000);
        if ((in_stack_00000018 & 1) == 0) {
          iVar4 = 0;
        }
        else {
          in_stack_fffffffffffffc48 = 0;
          in_stack_fffffffffffffc50 = (uint)bVar1;
          prioritizedEdgeAnchorOffset
                    (in_stack_fffffffffffffcc0,table_00,
                     (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                     ,cell_00,(EdgeData *)
                              CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
          iVar4 = qFloor<double>(4.14268461096087e-317);
        }
        QPointF::QPointF(&local_230,(qreal)cell_00,(double)iVar4);
        local_210 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_a0.xp = local_210.xp;
        local_a0.yp = local_210.yp;
        local_250 = QRectF::bottomRight(in_stack_fffffffffffffc58);
        xpos = -qVar5;
        if ((in_stack_00000020 & 1) == 0) {
          iVar4 = 0;
        }
        else {
          in_stack_fffffffffffffc48 = 1;
          in_stack_fffffffffffffc50 = 0;
          prioritizedEdgeAnchorOffset
                    (in_stack_fffffffffffffcc0,table_00,
                     (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                     ,cell_00,(EdgeData *)CONCAT44(iVar4,in_stack_fffffffffffffca0),
                     (Edge)((ulong)xpos >> 0x20),SUB81((ulong)qVar5 >> 0x18,0),
                     SUB81((ulong)qVar5 >> 0x10,0));
          iVar4 = qCeil<double>(4.14281504429137e-317);
          iVar4 = -iVar4;
        }
        QPointF::QPointF(&local_260,xpos,(double)iVar4);
        local_240 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_b0.xp = local_240.xp;
        local_b0.yp = local_240.yp;
        break;
      case (QTextTable *)0x2:
        qVar5 = QTextDocumentLayoutPrivate::scaleToDevice
                          (in_stack_fffffffffffffc68,(qreal)in_stack_fffffffffffffc60);
        local_160 = QRectF::bottomLeft(in_stack_fffffffffffffc58);
        uVar6 = 0;
        prioritizedEdgeAnchorOffset
                  (in_stack_fffffffffffffcc0,table_00,
                   (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   in_stack_fffffffffffffca8,
                   (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
        iVar4 = qFloor<double>(4.14215299632595e-317);
        QPointF::QPointF(&local_170,(double)iVar4,-qVar5);
        local_150 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)CONCAT44(in_stack_fffffffffffffc54,uVar6));
        local_a0.xp = local_150.xp;
        local_a0.yp = local_150.yp;
        local_190 = QRectF::bottomRight(in_stack_fffffffffffffc58);
        in_stack_fffffffffffffc48 = 1;
        in_stack_fffffffffffffc50 = 0;
        prioritizedEdgeAnchorOffset
                  (in_stack_fffffffffffffcc0,table_00,
                   (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
                   in_stack_fffffffffffffca8,
                   (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                   (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                   SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
        iVar4 = qCeil<double>(4.14226366703062e-317);
        QPointF::QPointF(&local_1a0,(double)-iVar4,-qVar5);
        local_180 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_b0.xp = local_180.xp;
        local_b0.yp = local_180.yp;
        break;
      case (QTextTable *)0x3:
        QTextDocumentLayoutPrivate::scaleToDevice
                  (in_stack_fffffffffffffc68,(qreal)in_stack_fffffffffffffc60);
        local_1c0 = QRectF::topLeft(in_stack_fffffffffffffc58);
        if ((in_stack_00000018 & 1) == 0) {
          iVar4 = 0;
        }
        else {
          in_stack_fffffffffffffc48 = 0;
          in_stack_fffffffffffffc50 = (uint)bVar1;
          prioritizedEdgeAnchorOffset
                    (in_stack_fffffffffffffcc0,table_00,
                     (QTextTableData *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0)
                     ,in_stack_fffffffffffffca8,
                     (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
          iVar4 = qFloor<double>(4.14241238079001e-317);
        }
        QPointF::QPointF(&local_1d0,0.0,(double)iVar4);
        local_1b0 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_a0.xp = local_1b0.xp;
        local_a0.yp = local_1b0.yp;
        local_1f0 = QRectF::bottomLeft(in_stack_fffffffffffffc58);
        if ((in_stack_00000020 & 1) == 0) {
          iVar4 = 0;
        }
        else {
          in_stack_fffffffffffffc48 = 1;
          in_stack_fffffffffffffc50 = 0;
          prioritizedEdgeAnchorOffset
                    (in_stack_fffffffffffffcc0,table_00,
                     (QTextTableData *)CONCAT44(iVar4,in_stack_fffffffffffffcb0),
                     in_stack_fffffffffffffca8,
                     (EdgeData *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                     (Edge)((ulong)in_stack_fffffffffffffc98 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x18,0),
                     SUB81((ulong)in_stack_fffffffffffffc98 >> 0x10,0));
          iVar4 = qCeil<double>(4.14252255742904e-317);
          iVar4 = -iVar4;
        }
        QPointF::QPointF(&local_200,0.0,(double)iVar4);
        local_1e0 = operator+((QPointF *)in_stack_fffffffffffffc58,
                              (QPointF *)
                              CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50));
        local_b0.xp = local_1e0.xp;
        local_b0.yp = local_1e0.yp;
      }
      if ((*(byte *)(in_RCX + 0x148) & 1) != 0) {
        local_278.xp = -NAN;
        local_278.yp = -NAN;
        QPointF::QPointF(&local_278);
        switch(in_stack_00000008) {
        case 0:
          collapseOffset((QTextDocumentLayoutPrivate *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (EdgeData *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          iVar4 = qCeil<double>(4.14293411411202e-317);
          QPointF::QPointF(&local_288,0.0,(double)-iVar4);
          local_278.xp = local_288.xp;
          local_278.yp = local_288.yp;
          break;
        case 1:
          collapseOffset((QTextDocumentLayoutPrivate *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (EdgeData *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          iVar4 = qFloor<double>(4.14306158304865e-317);
          QPointF::QPointF(&local_2b8,(double)iVar4,0.0);
          local_278.xp = local_2b8.xp;
          local_278.yp = local_2b8.yp;
          break;
        case 2:
          collapseOffset((QTextDocumentLayoutPrivate *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (EdgeData *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          iVar4 = qFloor<double>(4.1429780859545e-317);
          QPointF::QPointF(&local_298,0.0,(double)iVar4);
          local_278.xp = local_298.xp;
          local_278.yp = local_298.yp;
          break;
        case 3:
          collapseOffset((QTextDocumentLayoutPrivate *)
                         CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                         (EdgeData *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          iVar4 = qCeil<double>(4.14301909340311e-317);
          QPointF::QPointF(&local_2a8,(double)-iVar4,0.0);
          local_278.xp = local_2a8.xp;
          local_278.yp = local_2a8.yp;
        }
        QPointF::operator+=(&local_a0,&local_278);
        QPointF::operator+=(&local_b0,&local_278);
      }
      QPointF::x(&local_a0);
      QPointF::y(&local_a0);
      QPointF::x(&local_b0);
      QPointF::y(&local_b0);
      QBrush::QBrush((QBrush *)CONCAT44(in_stack_fffffffffffffc54,in_stack_fffffffffffffc50),
                     (QBrush *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      qDrawEdge(in_stack_00000100,in_stack_000000f8,(qreal)p,(qreal)painter,(qreal)table,(qreal)td,
                (qreal)cell,borderRect._4_4_,(BorderStyle)borderRect,
                (QBrush *)
                CONCAT17(adjustTopAnchor,
                         CONCAT16(adjustBottomAnchor,CONCAT15(ignoreEdgesAbove,in_stack_000000c0))))
      ;
      QBrush::~QBrush((QBrush *)0x7ff5c0);
      QTextTableCell::~QTextTableCell((QTextTableCell *)local_80);
    }
    QBrush::~QBrush((QBrush *)0x7ff5e5);
    QTextTableCellFormat::~QTextTableCellFormat((QTextTableCellFormat *)0x7ff5f2);
  }
  EdgeData::~EdgeData((EdgeData *)0x7ff5ff);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline
void drawCellBorder(const QTextDocumentLayoutPrivate *p, QPainter *painter,
                    QTextTable *table, const QTextTableData *td, const QTextTableCell &cell,
                    const QRectF &borderRect, QCss::Edge edge,
                    int forceHeaderRow, bool adjustTopAnchor, bool adjustBottomAnchor,
                    bool ignoreEdgesAbove)
{
    QPointF p1, p2;
    qreal wh = 0;
    qreal wv = 0;
    EdgeData edgeData = axisEdgeData(table, td, cell, edge);

    if (edgeData.width == 0)
        return;

    QTextTableCellFormat fmt = edgeData.cell.format().toTableCellFormat();
    QTextFrameFormat::BorderStyle borderStyle = QTextFrameFormat::BorderStyle_None;
    QBrush brush;

    if (edgeData.edgeClass != EdgeData::ClassExplicit && td->drawGrid) {
        borderStyle = table->format().borderStyle();
        brush = table->format().borderBrush();
    }
    else {
        switch (edgeData.edge) {
        case QCss::TopEdge:
            brush = fmt.topBorderBrush();
            borderStyle = fmt.topBorderStyle();
            break;
        case QCss::BottomEdge:
            brush = fmt.bottomBorderBrush();
            borderStyle = fmt.bottomBorderStyle();
            break;
        case QCss::LeftEdge:
            brush = fmt.leftBorderBrush();
            borderStyle = fmt.leftBorderStyle();
            break;
        case QCss::RightEdge:
            brush = fmt.rightBorderBrush();
            borderStyle = fmt.rightBorderStyle();
            break;
        default:
            Q_UNREACHABLE();
            break;
        }
    }

    if (borderStyle == QTextFrameFormat::BorderStyle_None)
        return;

    // assume black if not explicit brush is set
    if (brush.style() == Qt::NoBrush)
        brush = Qt::black;

    QTextTableCell cellOrHeader = cell;
    if (forceHeaderRow != -1)
        cellOrHeader = table->cellAt(forceHeaderRow, cell.column());

    // adjust start and end anchors (e.g. left/right for top) according to priority rules
    switch (edge) {
    case QCss::TopEdge:
        wv = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topLeft()
                + QPointF(qFloor(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::LeftEdge, false, ignoreEdgesAbove)), 0);
        p2 = borderRect.topRight()
                + QPointF(-qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::RightEdge, true, ignoreEdgesAbove)), 0);
        break;
    case QCss::BottomEdge:
        wv = p->scaleToDevice(edgeData.width);
        p1 = borderRect.bottomLeft()
                + QPointF(qFloor(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::LeftEdge, false, false)), -wv);
        p2 = borderRect.bottomRight()
                + QPointF(-qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::RightEdge, true, false)), -wv);
        break;
    case QCss::LeftEdge:
        wh = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topLeft()
                + QPointF(0, adjustTopAnchor ? qFloor(prioritizedEdgeAnchorOffset(p, table, td, cellOrHeader, edgeData,
                                                                                  forceHeaderRow != -1 ? QCss::BottomEdge : QCss::TopEdge,
                                                                                  false, ignoreEdgesAbove))
                                             : 0);
        p2 = borderRect.bottomLeft()
                + QPointF(0, adjustBottomAnchor ? -qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::BottomEdge, true, false))
                                                : 0);
        break;
    case QCss::RightEdge:
        wh = p->scaleToDevice(edgeData.width);
        p1 = borderRect.topRight()
                + QPointF(-wh, adjustTopAnchor ? qFloor(prioritizedEdgeAnchorOffset(p, table, td, cellOrHeader, edgeData,
                                                                                    forceHeaderRow != -1 ? QCss::BottomEdge : QCss::TopEdge,
                                                                                    false, ignoreEdgesAbove))
                                               : 0);
        p2 = borderRect.bottomRight()
                + QPointF(-wh, adjustBottomAnchor ? -qCeil(prioritizedEdgeAnchorOffset(p, table, td, cell, edgeData, QCss::BottomEdge, true, false))
                                                  : 0);
        break;
    default: break;
    }

    // for borderCollapse move edge width/2 pixel out of the borderRect
    // so that it shares space with the adjacent cell's edge.
    // to avoid fractional offsets, qCeil/qFloor is used
    if (td->borderCollapse) {
        QPointF offset;
        switch (edge) {
        case QCss::TopEdge:
            offset = QPointF(0, -qCeil(collapseOffset(p, edgeData)));
            break;
        case QCss::BottomEdge:
            offset = QPointF(0, qFloor(collapseOffset(p, edgeData)));
            break;
        case QCss::LeftEdge:
            offset = QPointF(-qCeil(collapseOffset(p, edgeData)), 0);
            break;
        case QCss::RightEdge:
            offset = QPointF(qFloor(collapseOffset(p, edgeData)), 0);
            break;
        default: break;
        }
        p1 += offset;
        p2 += offset;
    }

    QCss::BorderStyle cssStyle = static_cast<QCss::BorderStyle>(borderStyle + 1);

// this reveals errors in the drawing logic
#ifdef COLLAPSE_DEBUG
    QColor c = brush.color();
    c.setAlpha(150);
    brush.setColor(c);
#endif

    qDrawEdge(painter, p1.x(), p1.y(), p2.x() + wh, p2.y() + wv, 0, 0, edge, cssStyle, brush);
}